

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_info.cpp
# Opt level: O1

bool nodecpp::stack_info_impl::stackPointerToInfo(void *ptr,StackFrameInfo *info)

{
  size_type __len1;
  pointer pcVar1;
  uintptr_t uVar2;
  _Alloc_hider _Var3;
  size_type __len2;
  int iVar4;
  int iVar5;
  size_t __len2_00;
  void *pvVar6;
  long lVar7;
  size_type __size;
  ulong uVar8;
  size_type __n;
  ulong __pos;
  string r;
  Dl_info info_1;
  string local_b8;
  string local_98;
  stdstring local_78;
  char *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>_11
  local_38;
  
  iVar4 = dladdr();
  if (iVar4 != 0) {
    info->offset = (uintptr_t)ptr;
    info->offset2 = (long)ptr - (long)local_48;
    __len1 = (info->modulePath)._M_string_length;
    __len2_00 = strlen(local_50);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
    ::_M_replace(&info->modulePath,0,__len1,local_50,__len2_00);
    pcVar1 = (info->modulePath)._M_dataplus._M_p;
    local_48 = &local_38;
    std::__cxx11::
    basic_string<char,std::char_traits<char>,nodecpp::selective_allocator<nodecpp::StdRawAllocator,char>>
    ::_M_construct<char*>
              ((basic_string<char,std::char_traits<char>,nodecpp::selective_allocator<nodecpp::StdRawAllocator,char>>
                *)&local_50,pcVar1,pcVar1 + (info->modulePath)._M_string_length);
    callAddr2Line(&local_98,(stdstring *)&local_50,info->offset);
    if (local_48 != &local_38) {
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
      ::_M_destroy((basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
                    *)&local_50,local_38._M_allocated_capacity);
    }
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_98,"??\n??:0\n");
    if ((iVar5 == 0) && (info->offset2 != 0)) {
      pcVar1 = (info->modulePath)._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::
      basic_string<char,std::char_traits<char>,nodecpp::selective_allocator<nodecpp::StdRawAllocator,char>>
      ::_M_construct<char*>
                ((basic_string<char,std::char_traits<char>,nodecpp::selective_allocator<nodecpp::StdRawAllocator,char>>
                  *)&local_78,pcVar1,pcVar1 + (info->modulePath)._M_string_length);
      callAddr2Line(&local_b8,&local_78,info->offset2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_98,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
        ::_M_destroy(&local_78,local_78.field_2._M_allocated_capacity);
      }
      uVar2 = info->offset;
      info->offset = info->offset2;
      info->offset2 = uVar2;
    }
    __len2 = local_98._M_string_length;
    _Var3._M_p = local_98._M_dataplus._M_p;
    if (local_98._M_string_length != 0) {
      pvVar6 = memchr(local_98._M_dataplus._M_p,10,local_98._M_string_length);
      __n = (long)pvVar6 - (long)_Var3._M_p;
      if (__n == 0xffffffffffffffff || pvVar6 == (void *)0x0) {
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
        ::_M_replace(&info->functionName,0,(info->functionName)._M_string_length,_Var3._M_p,__len2);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_b8,&local_98,0,__n);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
        ::_M_replace(&info->functionName,0,(info->functionName)._M_string_length,
                     local_b8._M_dataplus._M_p,local_b8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        iVar5 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
                ::compare(&info->functionName,"??");
        _Var3._M_p = local_98._M_dataplus._M_p;
        if (iVar5 == 0) {
          (info->functionName)._M_string_length = 0;
          *(info->functionName)._M_dataplus._M_p = '\0';
        }
        __pos = __n + 1;
        uVar8 = 0xffffffffffffffff;
        if (__pos <= local_98._M_string_length && local_98._M_string_length - __pos != 0) {
          pvVar6 = memchr(local_98._M_dataplus._M_p + __pos,0x3a,local_98._M_string_length - __pos);
          uVar8 = -(ulong)(pvVar6 == (void *)0x0) | (long)pvVar6 - (long)_Var3._M_p;
        }
        if (uVar8 != 0xffffffffffffffff) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_b8,&local_98,__pos,uVar8 - __pos);
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
          ::_M_replace(&info->srcPath,0,(info->srcPath)._M_string_length,local_b8._M_dataplus._M_p,
                       local_b8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          iVar5 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
                  ::compare(&info->srcPath,"??");
          if (iVar5 == 0) {
            (info->srcPath)._M_string_length = 0;
            *(info->srcPath)._M_dataplus._M_p = '\0';
          }
          lVar7 = atol(local_98._M_dataplus._M_p + uVar8 + 1);
          info->line = (int)lVar7;
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  return iVar4 != 0;
}

Assistant:

bool stackPointerToInfo( void* ptr, nodecpp::stack_info_impl::StackFrameInfo& info )
	{
	#if defined(NODECPP_WINDOWS)

		static constexpr size_t TRACE_MAX_FUNCTION_NAME_LENGTH = 1024;
		HANDLE process = GetCurrentProcess();
		uint8_t symbolBuff[ sizeof(SYMBOL_INFO) + (TRACE_MAX_FUNCTION_NAME_LENGTH - 1) * sizeof(TCHAR) ];
		SYMBOL_INFO *symbol = (SYMBOL_INFO *)symbolBuff;
		symbol->MaxNameLen = TRACE_MAX_FUNCTION_NAME_LENGTH;
		symbol->SizeOfStruct = sizeof(SYMBOL_INFO);
		DWORD displacement = 0;
		IMAGEHLP_LINE64 line;
		DWORD64 address = (DWORD64)(ptr);
		bool addrOK = false;
	#ifndef _DEBUG
		addrOK = SymFromAddr(process, address, NULL, symbol);
	#endif
		bool fileLineOK = SymGetLineFromAddr64(process, address, &displacement, &line);

		if ( fileLineOK )
		{
			info.srcPath = line.FileName;
			info.line = line.LineNumber;
		}
		if ( addrOK )
			info.functionName = symbol->Name;
		return true;

	#elif defined(NODECPP_LINUX) && defined(NODECPP_GCC)

		nodecpp::stack_info_impl::ModuleAndOffset mao;
		if ( addrToModuleAndOffset( ptr, mao ) )
		{
			info.offset = mao.offsetInModule;
			info.modulePath = mao.modulePath;
			useAddr2Line( info );
			return true;
		}
		else
			return false;

	#elif defined(NODECPP_LINUX) && defined(NODECPP_CLANG)

		nodecpp::stack_info_impl::ModuleAndOffset mao;
		if ( addrToModuleAndOffset( ptr, mao ) )
		{
			// mb: I see strange behaviour on clang on linux.
			// when we are the main executable, ptr returned by
			// backtrace is already an offset. But is an absolute
			// address when we are a dynamic load library
			info.offset = reinterpret_cast<uintptr_t>(ptr);
			info.offset2 = mao.offsetInModule;
			info.modulePath = mao.modulePath;
			useAddr2Line( info );
			return true;
		}
		else
			return false;

	#elif defined(NODECPP_MAC)

		nodecpp::stack_info_impl::ModuleAndOffset mao;
		if ( addrToModuleAndOffset( ptr, mao ) )
		{
			info.offset = mao.offsetInModule;
			info.modulePath = mao.modulePath;
			// mb: addr2line is not found on mac, use atos
			useAtos( info );
			return true;
		}
		else
			return false;

	#elif defined(NODECPP_ANDROID)

		nodecpp::stack_info_impl::ModuleAndOffset mao;
		if ( addrToModuleAndOffset( ptr, mao ) )
		{
			// mb: clang on android behaves as gcc on linux,
			// and not as clang on linux
			info.offset = mao.offsetInModule;
			info.modulePath = mao.modulePath;

			// mb: addr2line is not present on the device, is on the host where cross compile took place, i.e.
			// %ANDROID_HOME%\ndk\24.0.8215888\toolchains\llvm\prebuilt\windows-x86_64\bin\llvm-addr2line.exe
			// useAddr2Line( info );
			return true;
		}
		else
			return false;

	#else
	#error platform not (yet) supported, use NODECPP_NO_STACK_INFO_IN_EXCEPTIONS
	#endif // platform/compiler
	}